

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

int nni_stat_snapshot(nni_stat **statp,nni_stat_item *item)

{
  nni_mtx *local_38;
  nni_mtx *mtx;
  nni_stat *stat;
  nni_stat_item *pnStack_20;
  int rv;
  nni_stat_item *item_local;
  nni_stat **statp_local;
  
  local_38 = (nni_mtx *)0x0;
  pnStack_20 = item;
  if (item == (nni_stat_item *)0x0) {
    pnStack_20 = &stats_root;
  }
  item_local = (nni_stat_item *)statp;
  nni_mtx_lock(&stats_lock);
  stat._4_4_ = stat_make_tree(pnStack_20,(nni_stat **)&mtx);
  if (stat._4_4_ == 0) {
    stat_update_tree((nni_stat *)mtx,&local_38);
    if (local_38 != (nni_mtx *)0x0) {
      nni_mtx_unlock(local_38);
    }
    nni_mtx_unlock(&stats_lock);
    (item_local->si_node).ln_next = (nni_list_node *)mtx;
    statp_local._4_4_ = 0;
  }
  else {
    nni_mtx_unlock(&stats_lock);
    statp_local._4_4_ = stat._4_4_;
  }
  return statp_local._4_4_;
}

Assistant:

int
nni_stat_snapshot(nni_stat **statp, nni_stat_item *item)
{
	int       rv;
	nni_stat *stat;
	nni_mtx  *mtx = NULL;

	if (item == NULL) {
		item = &stats_root;
	}
	nni_mtx_lock(&stats_lock);
	if ((rv = stat_make_tree(item, &stat)) != 0) {
		nni_mtx_unlock(&stats_lock);
		return (rv);
	}
	stat_update_tree(stat, &mtx);
	if (mtx != NULL) {
		nni_mtx_unlock(mtx);
	}
	nni_mtx_unlock(&stats_lock);
	*statp = stat;
	return (0);
}